

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O2

rpf_t * formula_output(stack_t *num,int *sp_num,stack_t *op,int *sp_op,int rank)

{
  int iVar1;
  int iVar2;
  rpf_t *rpf;
  long lVar3;
  stack_t *obj;
  ulong uVar4;
  rpf_t rpf2;
  rpf_t local_48;
  
  uVar4 = (ulong)(uint)*sp_op;
  while( true ) {
    if ((int)uVar4 < 1) {
      return (rpf_t *)num[(long)*sp_num + -1].value;
    }
    uVar4 = uVar4 - 1;
    local_48.type = TYPE_START;
    iVar1 = *(int *)((long)op[uVar4].value + 0x18);
    iVar2 = *sp_num;
    if (iVar2 < iVar1) break;
    lVar3 = (long)(iVar2 - iVar1);
    obj = num + lVar3;
    rpf = &local_48;
    for (; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      if (obj->type == TYPE_RPF) {
        rpf = rpf_join(rpf,(rpf_t *)obj->value);
      }
      else {
        rpf = rpf_push(rpf,obj);
      }
      iVar2 = *sp_num;
      obj = obj + 1;
    }
    *sp_num = iVar2 - iVar1;
    rpf_push(rpf,op + uVar4);
    *sp_op = *sp_op + -1;
    num[*sp_num].rank = 0;
    num[*sp_num].type = TYPE_RPF;
    iVar1 = *sp_num;
    num[iVar1].value = local_48.next;
    *sp_num = iVar1 + 1;
  }
  return (rpf_t *)0x0;
}

Assistant:

struct rpf_t *formula_output(struct stack_t *num, int *sp_num, struct stack_t *op, int *sp_op, int rank)
{
  /*{
		int i;
		printf("  op ");
		for(i = 0; i < *sp_op; i++)
			printf("%s ", ((struct operation_t*)op[i].value)->op);
		printf("\n  num ");
		for(i = 0; i < *sp_num; i++)
		{
			if(num[i].type == TYPE_RPF)
				printf("rpf ");
			else
				printf("%f ", *((double*)num[i].value));
		}
		printf("\n");
	}*/

  int sp_op2;
  for (sp_op2 = *sp_op - 1; sp_op2 >= 0; sp_op2--)
  {
    struct rpf_t rpf2, *rpf2_tmp;
    int sp_num2;

    rpf2_tmp = &rpf2;
    rpf2.type = TYPE_START;

    int num_cnt;
    num_cnt = ((struct operation_t *)op[sp_op2].value)->narg;
    if (num_cnt > *sp_num)
      return NULL;
    for (sp_num2 = *sp_num - num_cnt; sp_num2 < *sp_num; sp_num2++)
    {
      switch (num[sp_num2].type)
      {
        case TYPE_RPF:
          rpf2_tmp = rpf_join(rpf2_tmp, num[sp_num2].value);
          //printf(" rpf");
          break;
        default:
          rpf2_tmp = rpf_push(rpf2_tmp, &num[sp_num2]);
          //printf("%f ", *((double*)num[sp_num2].value));
          break;
      }
    }
    //printf("\n");
    (*sp_num) -= num_cnt;
    rpf2_tmp = rpf_push(rpf2_tmp, &op[sp_op2]);
    (*sp_op)--;

    num[*sp_num].rank = 0;
    num[*sp_num].type = TYPE_RPF;
    num[*sp_num].value = rpf2.next;
    (*sp_num)++;

    //formula_print(stdout, &rpf2);
    //printf("\n");
  }
  return num[*sp_num - 1].value;
}